

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afg2ampl.cpp
# Opt level: O2

int swig_main(int argc,char **argv)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  FILE *__s;
  runtime_error *prVar4;
  int i_2;
  uint uVar5;
  size_t i;
  uint *puVar6;
  ulong uVar7;
  pointer pIVar8;
  pointer pIVar9;
  pointer pAVar10;
  Arcflow afg;
  char _error_msg__1 [256];
  
  puts("VPSolver 3.1.3, Copyright (C) 2013-2022, Filipe Brandao");
  setvbuf(_stdout,(char *)0x0,2,0);
  if (argc == 4) {
    bVar2 = check_ext(argv[1],".afg");
    if (!bVar2) {
      snprintf(&afg.ready,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "check_ext(argv[1], \".afg\")",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2ampl.cpp"
               ,0x12);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,&afg.ready);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Arcflow::Arcflow(&afg,argv[1]);
    __stream = fopen(argv[2],"w");
    if (__stream == (FILE *)0x0) {
      perror("fopen");
      snprintf(_error_msg__1,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fmod != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2ampl.cpp"
               ,0x1a);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,_error_msg__1);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __s = fopen(argv[3],"w");
    if (__s == (FILE *)0x0) {
      snprintf(_error_msg__1,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fdat != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2ampl.cpp"
               ,0x20);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,_error_msg__1);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    printf("Generating the .mod file...");
    fputs("set Items;\nparam Demand{Items};\nset Labels;\nparam ItemId{Labels};\nparam ItemOpt{Labels};\n\nset V;\nset A dimen 3;\nparam S;\nparam LOSS;\nparam ArcId{A};\nparam ArcBounds{Labels union {LOSS}} default +Infinity;\nvar Flow{(u,v,l) in A} integer >= 0 <= ArcBounds[l];\nset Targets;\nparam Cost{Targets};\nparam Quantity{Targets};\n\nminimize TotalCost:\n    sum{t in Targets} Cost[t] * Flow[t,S,LOSS];\ns.t. BinQuantity{t in Targets: Quantity[t] >= 0}:\n    Flow[t,S,LOSS] <= Quantity[t];\nparam RelaxDomains default 1;\ns.t. SatisfyDemandStrict{i in Items: RelaxDomains != 1}:\n    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] == Demand[i];\ns.t. SatisfyDemandRelaxed{i in Items: RelaxDomains == 1}:\n    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] >= Demand[i];\ns.t. FlowConservation{k in V}:\n    (sum{(u,v,l) in A: v == k} Flow[u,v,l]) - (sum{(u,v,l) in A: u == k} Flow[u,v,l]) == 0;"
          ,__stream);
    fclose(__stream);
    printf("Generating the .dat file...");
    fwrite("data;\n",6,1,__s);
    fwrite("set Targets :=",0xe,1,__s);
    piVar1 = afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (puVar6 = (uint *)afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; puVar6 != (uint *)piVar1;
        puVar6 = puVar6 + 1) {
      fprintf(__s," %d",(ulong)*puVar6);
    }
    fwrite(";\n",2,1,__s);
    fwrite("param Cost :=",0xd,1,__s);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      fprintf(__s," %d %d",
              (ulong)(uint)afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7],
              (ulong)(uint)afg.inst.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7]);
    }
    fwrite(";\n",2,1,__s);
    fwrite("param Quantity :=",0x11,1,__s);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      fprintf(__s," %d %d",
              (ulong)(uint)afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7],
              (ulong)(uint)afg.inst.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7]);
    }
    fwrite(";\n",2,1,__s);
    fwrite("set Items :=",0xc,1,__s);
    for (uVar5 = 1; (int)(uVar5 - 1) < afg.inst.m; uVar5 = uVar5 + 1) {
      fprintf(__s," %d",(ulong)uVar5);
    }
    fwrite(";\n",2,1,__s);
    fwrite("param Demand :=",0xf,1,__s);
    uVar7 = 0;
    while ((long)uVar7 < (long)afg.inst.m) {
      puVar6 = (uint *)(afg.inst.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar7);
      uVar7 = uVar7 + 1;
      fprintf(__s," %d %d",uVar7 & 0xffffffff,(ulong)*puVar6);
    }
    fwrite(";\n",2,1,__s);
    fprintf(__s,"param RelaxDomains := %d;\n",(ulong)afg.inst.relax_domains);
    if (afg.inst.relax_domains == false) {
      fwrite("param ArcBounds :=",0x12,1,__s);
      pIVar9 = afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pIVar8 = afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start; pIVar8 != pIVar9; pIVar8 = pIVar8 + 1) {
        fprintf(__s," %d %d",(ulong)(uint)pIVar8->id,(ulong)(uint)pIVar8->demand);
      }
      fwrite(";\n",2,1,__s);
    }
    fwrite("set Labels :=",0xd,1,__s);
    pIVar9 = afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pIVar8 = afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_start; pIVar8 != pIVar9; pIVar8 = pIVar8 + 1) {
      fprintf(__s," %d",(ulong)(uint)pIVar8->id);
    }
    fwrite(";\n",2,1,__s);
    fwrite("param ItemId :=",0xf,1,__s);
    pIVar9 = afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pIVar8 = afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_start; pIVar8 != pIVar9; pIVar8 = pIVar8 + 1) {
      fprintf(__s," %d %d",(ulong)(uint)pIVar8->id,(ulong)(pIVar8->type + 1));
    }
    fwrite(";\n",2,1,__s);
    fwrite("param ItemOpt :=",0x10,1,__s);
    for (pIVar9 = afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar9 != afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_finish; pIVar9 = pIVar9 + 1) {
      fprintf(__s," %d %d",(ulong)(uint)pIVar9->id,(ulong)(pIVar9->opt + 1));
    }
    fwrite(";\n",2,1,__s);
    fprintf(__s,"param S := %d;\n",(ulong)(uint)afg.S);
    fprintf(__s,"param LOSS := %d;\n",(ulong)(uint)afg.LOSS);
    fwrite("set V :=",8,1,__s);
    for (uVar5 = 0; (int)uVar5 < afg.NV; uVar5 = uVar5 + 1) {
      fprintf(__s," %d",(ulong)uVar5);
    }
    fwrite(";\n",2,1,__s);
    fwrite("set A :=",8,1,__s);
    for (pAVar10 = afg.A.super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pAVar10 !=
        afg.A.super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
        _M_finish; pAVar10 = pAVar10 + 1) {
      fprintf(__s," (%d, %d, %d)",(ulong)(uint)pAVar10->u,(ulong)(uint)pAVar10->v,
              (ulong)(uint)pAVar10->label);
    }
    fwrite(";\n",2,1,__s);
    fclose(__s);
    puts("DONE!");
    Arcflow::~Arcflow(&afg);
    iVar3 = 0;
  }
  else {
    puts("Usage: afg2ampl graph.afg model.mod data.dat");
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int swig_main(int argc, char **argv) {
	printf(PACKAGE_STRING", Copyright (C) 2013-2022, Filipe Brandao\n");
	setvbuf(stdout, NULL, _IONBF, 0);
	if (argc != 4) {
		printf("Usage: afg2ampl graph.afg model.mod data.dat\n");
		return 1;
	}
	try {
		throw_assert(check_ext(argv[1], ".afg"));
		Arcflow afg(argv[1]);
		Instance &inst = afg.inst;

		FILE *fmod = fopen(argv[2], "w");
		if (fmod == NULL) {
			perror("fopen");
		}
		throw_assert(fmod != NULL);

		FILE *fdat = fopen(argv[3], "w");
		if (fmod == NULL) {
			perror("fopen");
		}
		throw_assert(fdat != NULL);

		/* model file */
		printf("Generating the .mod file...");
		const char *model = \
			"set Items;\n"
			"param Demand{Items};\n"
			"set Labels;\n"
			"param ItemId{Labels};\n"
			"param ItemOpt{Labels};\n"
			"\n"
			"set V;\n"
			"set A dimen 3;\n"
			"param S;\n"
			"param LOSS;\n"
			"param ArcId{A};\n"
			"param ArcBounds{Labels union {LOSS}} default +Infinity;\n"
			"var Flow{(u,v,l) in A} integer >= 0 <= ArcBounds[l];\n"
			"set Targets;\n"
			"param Cost{Targets};\n"
			"param Quantity{Targets};\n"
			"\n"
			"minimize TotalCost:\n"
			"    sum{t in Targets} Cost[t] * Flow[t,S,LOSS];\n"
			"s.t. BinQuantity{t in Targets: Quantity[t] >= 0}:\n"
			"    Flow[t,S,LOSS] <= Quantity[t];\n"
			"param RelaxDomains default 1;\n"
			"s.t. SatisfyDemandStrict{i in Items: RelaxDomains != 1}:\n"
			"    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] == Demand[i];\n"
			"s.t. SatisfyDemandRelaxed{i in Items: RelaxDomains == 1}:\n"
			"    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] >= Demand[i];\n"
			"s.t. FlowConservation{k in V}:\n"
			"    (sum{(u,v,l) in A: v == k} Flow[u,v,l]) - (sum{(u,v,l) in A: u == k} Flow[u,v,l]) == 0;";
		fprintf(fmod, "%s", model);
		fclose(fmod);

		/* data file */
		printf("Generating the .dat file...");
		fprintf(fdat, "data;\n");
		fprintf(fdat, "set Targets :=");
		for (const int t : afg.Ts) {
			fprintf(fdat, " %d", t);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param Cost :=");
		for (size_t i = 0; i < afg.Ts.size(); i++) {
			fprintf(fdat, " %d %d", afg.Ts[i], inst.Cs[i]);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param Quantity :=");
		for (size_t i = 0; i < afg.Ts.size(); i++) {
			fprintf(fdat, " %d %d", afg.Ts[i], inst.Qs[i]);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "set Items :=");
		for (int i = 0; i < inst.m; i++) {
			fprintf(fdat, " %d", i+1);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param Demand :=");
		for (int i = 0; i < inst.m; i++) {
			fprintf(fdat, " %d %d", i+1, inst.demands[i]);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param RelaxDomains := %d;\n", inst.relax_domains);

		if (!inst.relax_domains) {
			fprintf(fdat, "param ArcBounds :=");
			for (const Item &item : inst.items) {
				fprintf(fdat, " %d %d", item.id, item.demand);
			}
			fprintf(fdat, ";\n");
		}

		fprintf(fdat, "set Labels :=");
		for (const Item &item : inst.items) {
			fprintf(fdat, " %d", item.id);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param ItemId :=");
		for (const Item &item : inst.items) {
			fprintf(fdat, " %d %d", item.id, item.type+1);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param ItemOpt :=");
		for (const Item &item : inst.items) {
			fprintf(fdat, " %d %d", item.id, item.opt+1);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param S := %d;\n", afg.S);
		fprintf(fdat, "param LOSS := %d;\n", afg.LOSS);

		fprintf(fdat, "set V :=");
		for (int i = 0 ; i < afg.NV; i++) {
			fprintf(fdat, " %d", i);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "set A :=");
		for (const Arc &a : afg.A) {
			fprintf(fdat, " (%d, %d, %d)", a.u, a.v, a.label);
		}
		fprintf(fdat, ";\n");
		fclose(fdat);

		printf("DONE!\n");
		return 0;
	} catch (const std::runtime_error &e) {
		printf("%s\n", e.what());
		return 1;
	} catch (...) {
		printf("UnknownError\n");
		return 1;
	}
}